

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall CBlockPolicyEstimator::FlushFeeEstimates(CBlockPolicyEstimator *this)

{
  path *this_00;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar1;
  FILE *file;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  AutoFile est_file;
  path local_60;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_estimation_filepath;
  file = fsbridge::fopen((char *)this_00,"wb");
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&est_file,(FILE *)file,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xffffffffffffff58);
  if (est_file.m_file != (FILE *)0x0) {
    bVar1 = Write(this,&est_file);
    if (bVar1) {
      fs::path::filename((path *)&local_60,this_00);
      std::filesystem::__cxx11::path::string(&local_38,&local_60);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "FlushFeeEstimates";
      logging_function._M_len = 0x11;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x3bc,ALL,Info,(ConstevalFormatString<1U>)0xcb7bed,
                 &local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::filesystem::__cxx11::path::~path(&local_60);
      goto LAB_007bdbfb;
    }
  }
  std::filesystem::__cxx11::path::string(&local_60._M_pathname,&this_00->super_path);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
  ;
  source_file_00._M_len = 0x5f;
  logging_function_00._M_str = "FlushFeeEstimates";
  logging_function_00._M_len = 0x11;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,0x3ba,ALL,Info,(ConstevalFormatString<1U>)0xcb7bb6,
             &local_60._M_pathname);
  std::__cxx11::string::~string((string *)&local_60);
LAB_007bdbfb:
  AutoFile::~AutoFile(&est_file);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::FlushFeeEstimates()
{
    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "wb")};
    if (est_file.IsNull() || !Write(est_file)) {
        LogPrintf("Failed to write fee estimates to %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    } else {
        LogPrintf("Flushed fee estimates to %s.\n", fs::PathToString(m_estimation_filepath.filename()));
    }
}